

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_message.hpp
# Opt level: O0

iuStreamMessage * __thiscall
iutest::detail::iuStreamMessage::operator<<
          (iuStreamMessage *this,
          variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDX;
  string local_38;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value_local;
  iuStreamMessage *this_local;
  
  local_18 = value;
  value_local = (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this;
  PrintToString<std::variant<int,float,std::__cxx11::string>>(&local_38,(iutest *)value,in_RDX);
  std::operator<<((ostream *)&(this->m_stream).super_iu_stringstream.field_0x10,(string *)&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

iuStreamMessage& operator << (const T& value)
    {
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
        m_stream << PrintToString(value);
#else
        m_stream << value;
#endif
        return *this;
    }